

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O3

void __thiscall Excel::Stream::read<long>(Stream *this,long *retVal,int32_t bytes)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  Exception *this_00;
  byte bVar4;
  int iVar5;
  long lVar6;
  wstring local_50;
  
  *retVal = 0;
  uVar3 = 8;
  if (bytes != 0) {
    uVar3 = (ulong)(uint)bytes;
  }
  if (0 < (int)uVar3) {
    iVar5 = (int)uVar3 * 8;
    lVar6 = 0;
    do {
      iVar5 = iVar5 + -8;
      uVar1 = (*this->_vptr_Stream[2])(this);
      iVar2 = (*this->_vptr_Stream[3])(this);
      if ((char)iVar2 != '\0') {
        this_00 = (Exception *)__cxa_allocate_exception(0x30);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_50,L"Unexpected end of file.",L"");
        Exception::Exception(this_00,&local_50);
        __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
      }
      bVar4 = (byte)iVar5;
      if (this->m_byteOrder == (uint)(*SystemByteOrder::byteOrder()::byte != '\0')) {
        bVar4 = (byte)lVar6;
      }
      *retVal = *retVal | (ulong)(uVar1 & 0xff) << (bVar4 & 0x3f);
      lVar6 = lVar6 + 8;
    } while (uVar3 << 3 != lVar6);
  }
  return;
}

Assistant:

void read( Type & retVal, int32_t bytes = 0 )
	{
		retVal = Type(0);
		if( bytes == 0 ) bytes = sizeof( Type );

		for( int32_t i = 0; i < bytes; ++i )
		{
			Type c = (Type)(unsigned char) getByte();

			if( eof() )
				throw Exception( L"Unexpected end of file." );

			if( SystemByteOrder::byteOrder() != m_byteOrder )
				retVal |= ( c << 8 * ( bytes - i - 1 ) );
			else
				retVal |= ( c << 8 * i );
		}
	}